

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsImport.cpp
# Opt level: O0

int rotate_point(double cx,double cy,double angle,POINT *subject)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double ynew;
  double xnew;
  double c;
  double s;
  POINT p;
  POINT *subject_local;
  double angle_local;
  double cy_local;
  double cx_local;
  
  dVar3 = subject->x;
  dVar4 = subject->y;
  dVar1 = (angle * 3.141592653589) / 180.0;
  dVar2 = sin(dVar1);
  dVar1 = cos(dVar1);
  dVar3 = dVar3 - cx;
  dVar4 = dVar4 - cy;
  dVar5 = round(dVar3 * dVar1 + -(dVar4 * dVar2) + cx);
  dVar3 = round(dVar3 * dVar2 + dVar4 * dVar1 + cy);
  subject->x = dVar5;
  subject->y = dVar3;
  return 0;
}

Assistant:

int rotate_point(double cx, double cy, double angle, POINT &subject)
{
  POINT p = subject;
  angle = angle * 3.141592653589 / 180; // convert angle to radians
  double s = sin(angle);
  double c = cos(angle);

  // translate point back to origin:
  p.x -= cx;
  p.y -= cy;

  // rotate point
  double xnew = p.x * c - p.y * s;
  double ynew = p.x * s + p.y * c;

  // translate point back:
  p.x = round(xnew + cx);
  p.y = round(ynew + cy);
  subject = p;         // Overwrite the original point with the rotated one.
  return EXIT_SUCCESS; // Indicate successful conversion.
}